

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

pair<unsigned_long,_short> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::_Pool::
Release(_Pool *this,
       Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
       *pNode)

{
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *pNVar1
  ;
  pointer pNVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  pair<unsigned_long,_short> pVar5;
  
  uVar3 = (pNode->_value).first;
  uVar4 = (pNode->_value).second;
  pVar5.second = uVar4;
  pVar5.first = uVar3;
  pNVar1 = this->cache;
  this->cache = pNode;
  if ((pNVar1 != (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                  *)0x0) &&
     (pNVar2 = (pNVar1->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, pNVar2 != (pointer)0x0)) {
    operator_delete(pNVar2);
  }
  operator_delete(pNVar1);
  pVar5._10_6_ = 0;
  return pVar5;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}